

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello_world.cpp
# Opt level: O0

void __thiscall hello::csrf(hello *this)

{
  bool bVar1;
  undefined8 in_RDI;
  csrf c;
  char *in_stack_fffffffffffff998;
  allocator *paVar2;
  undefined7 in_stack_fffffffffffff9a0;
  byte in_stack_fffffffffffff9a7;
  csrf *in_stack_fffffffffffff9c0;
  allocator local_619;
  string local_618 [32];
  request local_5f8 [32];
  undefined1 local_5d8 [312];
  char (*in_stack_fffffffffffffb60) [3];
  string *in_stack_fffffffffffffb68;
  session_interface *in_stack_fffffffffffffb70;
  context local_78 [48];
  undefined1 local_48;
  allocator local_29;
  string local_28 [40];
  
  cppcms::application::session();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"name",&local_29);
  cppcms::session_interface::set<char[3]>
            (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  view::csrf::csrf(in_stack_fffffffffffff9c0);
  cppcms::application::request();
  cppcms::http::request::request_method_abi_cxx11_(local_5f8);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffff9a7,in_stack_fffffffffffff9a0),
                          in_stack_fffffffffffff998);
  std::__cxx11::string::~string((string *)local_5f8);
  if (bVar1) {
    cppcms::application::context();
    cppcms::form::load(local_78);
    in_stack_fffffffffffff9a7 = cppcms::form::validate();
    if ((in_stack_fffffffffffff9a7 & 1) != 0) {
      local_48 = 1;
    }
  }
  paVar2 = &local_619;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_618,"csrf",paVar2);
  cppcms::application::render(in_RDI,local_618,local_5d8);
  std::__cxx11::string::~string(local_618);
  std::allocator<char>::~allocator((allocator<char> *)&local_619);
  view::csrf::~csrf((csrf *)CONCAT17(in_stack_fffffffffffff9a7,in_stack_fffffffffffff9a0));
  return;
}

Assistant:

void csrf()
	{
		session().set("name","me");
		view::csrf c;
		if(request().request_method() == "POST") {
			c.my_form.load(context());
			if(c.my_form.validate()) {
				c.valid=true;
			}
		}
		render("csrf",c);
	}